

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

ast * allocast(int nodetype,char *name,YYLTYPE *pos,int num,...)

{
  ast *paVar1;
  ast *paVar2;
  int iVar3;
  int iVar4;
  char in_AL;
  ast *paVar5;
  YYLTYPE *pYVar6;
  ast **ppaVar7;
  int iVar8;
  void **ppvVar9;
  ulong uVar10;
  void **ppvVar11;
  ast *in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uint local_f8;
  void *local_d8 [4];
  ast *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ppvVar9 = &ap[0].overflow_arg_area;
  local_f8 = 0x20;
  local_b8 = in_R8;
  local_b0 = in_R9;
  paVar5 = (ast *)malloc(0x50);
  *(undefined8 *)paVar5 = 0;
  paVar5->name = (char *)0x0;
  paVar5->val = (value *)0x0;
  paVar5->left = (ast *)0x0;
  paVar5->right = (ast *)0x0;
  paVar5->pre = (ast *)0x0;
  paVar5->pos = (YYLTYPE *)0x0;
  paVar5->filename = (char *)0x0;
  paVar5->parent = (ast *)0x0;
  paVar5->lex = (char *)0x0;
  if (paVar5 == (ast *)0x0) {
LAB_00105603:
    err(1,"malloc");
  }
  if (pos == (YYLTYPE *)0x0) {
    paVar5->pos = (YYLTYPE *)0x0;
  }
  else {
    pYVar6 = (YYLTYPE *)malloc(0x10);
    paVar5->pos = pYVar6;
    if (pYVar6 == (YYLTYPE *)0x0) goto LAB_00105603;
    iVar8 = pos->first_column;
    iVar3 = pos->last_line;
    iVar4 = pos->last_column;
    pYVar6->first_line = pos->first_line;
    pYVar6->first_column = iVar8;
    pYVar6->last_line = iVar3;
    pYVar6->last_column = iVar4;
  }
  paVar5->type = nodetype;
  if (num == 0) {
    local_b8 = (ast *)0x0;
  }
  else {
    local_f8 = 0x28;
  }
  paVar5->left = local_b8;
  if (1 < num) {
    ppaVar7 = &paVar5->left;
    iVar8 = num + 1;
    do {
      paVar1 = *ppaVar7;
      paVar1->parent = paVar5;
      if (local_f8 < 0x29) {
        uVar10 = (ulong)local_f8;
        local_f8 = local_f8 + 8;
        ppvVar11 = (void **)((long)local_d8 + uVar10);
      }
      else {
        ppvVar11 = ppvVar9;
        ppvVar9 = ppvVar9 + 1;
      }
      paVar2 = (ast *)*ppvVar11;
      paVar1->right = paVar2;
      if (paVar2 != (ast *)0x0) {
        paVar2->pre = paVar1;
      }
      ppaVar7 = &paVar1->right;
      iVar8 = iVar8 + -1;
    } while (2 < iVar8);
  }
  paVar5->name = name;
  paVar5->filename = cur_file;
  return paVar5;
}

Assistant:

struct ast *allocast(int nodetype, const char *name, struct YYLTYPE *pos, int num, ...) {
    va_list ap;
    va_start(ap, num);
    struct ast *node = malloc(sizeof(struct ast));
    memset(node, 0, sizeof(struct ast));
    if (!node)
        err(EXIT_FAILURE, "malloc");
    if (pos) {
        node->pos = malloc(sizeof(struct YYLTYPE));
        if (!node->pos)
            err(EXIT_FAILURE, "malloc");
        *(node->pos) = *pos;
    } else
        node->pos = NULL;
    node->type = nodetype;
    if (num != 0)
        node->left = va_arg(ap, struct ast*);
    else
        node->left = NULL;
    struct ast *p = node->left;
    while (--num > 0) {
        p->parent = node;
        p->right = va_arg(ap, struct ast*);
        if (p->right)
            p->right->pre = p;
        p = p->right;
    }
    va_end(ap);
    node->name = name;
    node->filename = cur_file;
    return node;
}